

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeparse.cpp
# Opt level: O1

void yydestruct(char *yymsg,yysymbol_kind_t_conflict yykind,PCODEPARSESTYPE *yyvaluep)

{
  ExprTree *this;
  OpTpl *this_00;
  long *plVar1;
  int iVar2;
  ConstructTpl *this_01;
  undefined4 in_register_00000034;
  VarnodeTpl *pVVar3;
  ulong uVar4;
  
  plVar1 = (long *)CONCAT44(in_register_00000034,yykind);
  iVar2 = (int)yymsg;
  switch(iVar2) {
  case 0x53:
    this_01 = (ConstructTpl *)*plVar1;
    if (this_01 == (ConstructTpl *)0x0) {
      return;
    }
    ConstructTpl::~ConstructTpl(this_01);
    break;
  case 0x54:
    if (*plVar1 == 0) {
      return;
    }
    this_01 = (ConstructTpl *)*plVar1;
    pVVar3 = *(VarnodeTpl **)this_01;
    if ((VarnodeTpl *)
        (this_01->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
        super__Vector_impl_data._M_start != pVVar3) {
      uVar4 = 0;
      do {
        this_00 = *(OpTpl **)(&(pVVar3->space).type + uVar4 * 2);
        if (this_00 != (OpTpl *)0x0) {
          OpTpl::~OpTpl(this_00);
          operator_delete(this_00);
        }
        uVar4 = uVar4 + 1;
        this_01 = (ConstructTpl *)*plVar1;
        pVVar3 = *(VarnodeTpl **)this_01;
      } while (uVar4 < (ulong)((long)(this_01->vec).
                                     super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
                                     super__Vector_impl_data._M_start - (long)pVVar3 >> 3));
    }
    goto LAB_0033736a;
  case 0x55:
    this_01 = (ConstructTpl *)*plVar1;
    if (this_01 == (ConstructTpl *)0x0) {
      return;
    }
    ExprTree::~ExprTree((ExprTree *)this_01);
    break;
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
switchD_0033729e_caseD_56:
    this_01 = (ConstructTpl *)*plVar1;
    if (this_01 == (ConstructTpl *)0x0) {
      return;
    }
    break;
  case 0x5b:
  case 0x5c:
    return;
  case 0x5d:
    this_01 = (ConstructTpl *)*plVar1;
    pVVar3 = *(VarnodeTpl **)this_01;
    if ((VarnodeTpl *)
        (this_01->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
        super__Vector_impl_data._M_start != pVVar3) {
      uVar4 = 0;
      do {
        this = *(ExprTree **)(&(pVVar3->space).type + uVar4 * 2);
        if (this != (ExprTree *)0x0) {
          ExprTree::~ExprTree(this);
          operator_delete(this);
        }
        uVar4 = uVar4 + 1;
        this_01 = (ConstructTpl *)*plVar1;
        pVVar3 = *(VarnodeTpl **)this_01;
      } while (uVar4 < (ulong)((long)(this_01->vec).
                                     super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
                                     super__Vector_impl_data._M_start - (long)pVVar3 >> 3));
    }
LAB_0033736a:
    if (pVVar3 != (VarnodeTpl *)0x0) {
LAB_0033736f:
      operator_delete(pVVar3);
    }
    break;
  default:
    if (iVar2 == 0x41) goto switchD_0033729e_caseD_56;
    if (iVar2 != 0x42) {
      return;
    }
    this_01 = (ConstructTpl *)*plVar1;
    if (this_01 == (ConstructTpl *)0x0) {
      return;
    }
    pVVar3 = *(VarnodeTpl **)this_01;
    if (pVVar3 == (VarnodeTpl *)
                  &(this_01->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
                   super__Vector_impl_data._M_finish) break;
    goto LAB_0033736f;
  }
  operator_delete(this_01);
  return;
}

Assistant:

static void
yydestruct (const char *yymsg,
            yysymbol_kind_t yykind, YYSTYPE *yyvaluep)
{
  YY_USE (yyvaluep);
  if (!yymsg)
    yymsg = "Deleting";
  YY_SYMBOL_PRINT (yymsg, yykind, yyvaluep, yylocationp);

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  switch (yykind)
    {
    case YYSYMBOL_INTEGER: /* INTEGER  */
#line 90 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { delete ((*yyvaluep).i); }
#line 1419 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

    case YYSYMBOL_STRING: /* STRING  */
#line 91 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { delete ((*yyvaluep).str); }
#line 1425 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

    case YYSYMBOL_rtlmid: /* rtlmid  */
#line 93 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { delete ((*yyvaluep).sem); }
#line 1431 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

    case YYSYMBOL_statement: /* statement  */
#line 94 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { if (((*yyvaluep).stmt) != (vector<OpTpl *> *)0) { for(int4 i=0;i<((*yyvaluep).stmt)->size();++i) delete (*((*yyvaluep).stmt))[i]; delete ((*yyvaluep).stmt);} }
#line 1437 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

    case YYSYMBOL_expr: /* expr  */
#line 95 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { delete ((*yyvaluep).tree); }
#line 1443 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

    case YYSYMBOL_sizedstar: /* sizedstar  */
#line 97 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { delete ((*yyvaluep).starqual); }
#line 1449 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

    case YYSYMBOL_jumpdest: /* jumpdest  */
#line 96 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { if (((*yyvaluep).varnode) != (VarnodeTpl *)0) delete ((*yyvaluep).varnode); }
#line 1455 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

    case YYSYMBOL_varnode: /* varnode  */
#line 96 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { if (((*yyvaluep).varnode) != (VarnodeTpl *)0) delete ((*yyvaluep).varnode); }
#line 1461 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

    case YYSYMBOL_integervarnode: /* integervarnode  */
#line 96 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { if (((*yyvaluep).varnode) != (VarnodeTpl *)0) delete ((*yyvaluep).varnode); }
#line 1467 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

    case YYSYMBOL_lhsvarnode: /* lhsvarnode  */
#line 96 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { if (((*yyvaluep).varnode) != (VarnodeTpl *)0) delete ((*yyvaluep).varnode); }
#line 1473 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

    case YYSYMBOL_paramlist: /* paramlist  */
#line 92 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/pcodeparse.y"
            { for(int4 i=0;i<((*yyvaluep).param)->size();++i) delete (*((*yyvaluep).param))[i]; delete ((*yyvaluep).param); }
#line 1479 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/pcodeparse.cpp"
        break;

      default:
        break;
    }
  YY_IGNORE_MAYBE_UNINITIALIZED_END
}